

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

size_t nlohmann::detail::
       binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
       ::calc_bson_element_size
                 (string_t *name,
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *j)

{
  undefined1 *puVar1;
  size_t sVar2;
  
  puVar1 = (undefined1 *)calc_bson_entry_header_size(name,j);
  switch(j->m_type) {
  case null:
    break;
  case object:
    sVar2 = calc_bson_object_size((j->m_value).object);
    goto LAB_00116a20;
  case array:
    sVar2 = calc_bson_array_size((j->m_value).array);
LAB_00116a20:
    puVar1 = puVar1 + sVar2;
    break;
  case string:
    puVar1 = &((((j->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)->field_0x5 + (long)puVar1;
    break;
  case boolean:
    puVar1 = puVar1 + 1;
    break;
  case number_integer:
    puVar1 = puVar1 + (ulong)((long)(int)(j->m_value).number_integer != (j->m_value).number_integer)
                      * 4 + 4;
    break;
  case number_unsigned:
    puVar1 = puVar1 + (ulong)((object_t *)0x7fffffff < (j->m_value).object) * 4 + 4;
    break;
  case number_float:
    puVar1 = puVar1 + 8;
    break;
  case binary:
    puVar1 = puVar1 + (5 - (long)(((j->m_value).array)->
                                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) +
             (long)&((((j->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish)->m_type;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/vijaiaeroastro[P]nastranToJson/include/json.hpp"
                  ,0x399b,
                  "static std::size_t nlohmann::detail::binary_writer<nlohmann::basic_json<>, unsigned char>::calc_bson_element_size(const string_t &, const BasicJsonType &) [BasicJsonType = nlohmann::basic_json<>, CharType = unsigned char]"
                 );
  }
  return (size_t)puVar1;
}

Assistant:

static std::size_t calc_bson_element_size(const string_t& name,
            const BasicJsonType& j)
    {
        const auto header_size = calc_bson_entry_header_size(name, j);
        switch (j.type())
        {
            case value_t::object:
                return header_size + calc_bson_object_size(*j.m_value.object);

            case value_t::array:
                return header_size + calc_bson_array_size(*j.m_value.array);

            case value_t::binary:
                return header_size + calc_bson_binary_size(*j.m_value.binary);

            case value_t::boolean:
                return header_size + 1ul;

            case value_t::number_float:
                return header_size + 8ul;

            case value_t::number_integer:
                return header_size + calc_bson_integer_size(j.m_value.number_integer);

            case value_t::number_unsigned:
                return header_size + calc_bson_unsigned_size(j.m_value.number_unsigned);

            case value_t::string:
                return header_size + calc_bson_string_size(*j.m_value.string);

            case value_t::null:
                return header_size + 0ul;

            // LCOV_EXCL_START
            case value_t::discarded:
            default:
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert)
                return 0ul;
                // LCOV_EXCL_STOP
        }
    }